

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::addCols(HEkk *this,HighsLp *lp,HighsSparseMatrix *scaled_a_matrix)

{
  undefined8 in_RDX;
  HEkk *in_RSI;
  HSimplexNla *in_RDI;
  HighsLp *in_stack_ffffffffffffffd8;
  LpAction action;
  
  action = (LpAction)((ulong)in_RDX >> 0x20);
  if (((ulong)in_RDI[3].factor_.mwz_column_index.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x1000000000000) != 0) {
    HSimplexNla::addCols(in_RDI,in_stack_ffffffffffffffd8);
  }
  updateStatus(in_RSI,action);
  return;
}

Assistant:

void HEkk::addCols(const HighsLp& lp,
                   const HighsSparseMatrix& scaled_a_matrix) {
  // Should be extendSimplexLpRandomVectors
  //  if (valid_simplex_basis)
  //    appendBasicRowsToBasis(simplex_lp, simplex_basis, XnumNewRow);
  //  ekk_instance_.updateStatus(LpAction::kNewRows);
  //  if (valid_simplex_lp) {
  //    simplex_lp.num_row_ += XnumNewRow;
  //    ekk_instance_.initialiseSimplexLpRandomVectors();
  //  }
  //  if (valid_simplex_lp)
  //    assert(ekk_instance_.lp_.dimensionsOk("addCols - simplex"));
  if (this->status_.has_nla) this->simplex_nla_.addCols(&lp);
  this->updateStatus(LpAction::kNewCols);
}